

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmPreModify(LlvmCompilationContext *ctx,ExprPreModify *node)

{
  ExpressionContext *this;
  long lVar1;
  LLVMValueRef pLVar2;
  TypeBase *pTVar3;
  TypeBase *type;
  
  CompileLlvm(ctx,node->value);
  pTVar3 = node->value->type;
  if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x12)) {
    pTVar3 = (TypeBase *)0x0;
  }
  if (pTVar3 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x319,
                  "LLVMValueRef CompileLlvmPreModify(LlvmCompilationContext &, ExprPreModify *)");
  }
  ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,(TypeBase *)pTVar3[1]._vptr_TypeBase);
  type = (TypeBase *)pTVar3[1]._vptr_TypeBase;
  this = ctx->ctx;
  lVar1 = 0x89d8;
  if (((this->typeBool != type) && (this->typeChar != type)) && (this->typeShort != type)) {
    if (this->typeFloat != type) goto LAB_0026b582;
    lVar1 = 0x89f0;
  }
  type = *(TypeBase **)((long)(this->uniqueDependencies).little + lVar1 + -0x30);
LAB_0026b582:
  ExpressionContext::IsIntegerType(this,type);
  CompileLlvmType(ctx,type);
  ConvertToDataType(ctx,(LLVMValueRef)&placeholderValue,type,(TypeBase *)pTVar3[1]._vptr_TypeBase);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmPreModify(LlvmCompilationContext &ctx, ExprPreModify *node)
{
	LLVMValueRef address = CompileLlvm(ctx, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	LLVMValueRef value = ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, address, ""), refType->subType);

	TypeBase *stackType = GetStackType(ctx, refType->subType);

	if(ctx.ctx.IsIntegerType(stackType))
		value = LLVMBuildAdd(ctx.builder, value, LLVMConstInt(CompileLlvmType(ctx, stackType), node->isIncrement ? 1 : -1, true), "");
	else
		value = LLVMBuildFAdd(ctx.builder, value, LLVMConstReal(CompileLlvmType(ctx, stackType), node->isIncrement ? 1.0 : -1.0), "");

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, value, stackType, refType->subType), address);

	return CheckType(ctx, node, value);
}